

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbaWriteVer.c
# Opt level: O3

void Cba_ManWriteVerilog(char *pFileName,Cba_Man_t *p,int fInlineConcat)

{
  char cVar1;
  uint uVar2;
  void *pvVar3;
  size_t sVar4;
  void *pvVar5;
  char *pcVar6;
  size_t sVar7;
  char *pcVar8;
  FILE *__s;
  int i;
  long lVar9;
  ulong uVar10;
  int i_1;
  int iVar11;
  
  pvVar3 = p->pMioLib;
  if (pvVar3 != (void *)0x0) {
    pvVar5 = Abc_FrameReadLibGen();
    if (pvVar3 != pvVar5) {
      puts("Genlib library used in the mapped design is not longer a current library.");
      return;
    }
  }
  Cba_ManCreatePrimMap(p->pTypeNames);
  p->nOpens = 1;
  iVar11 = 0;
  (p->vOut).nSize = 0;
  (p->vOut2).nSize = 0;
  lVar9 = 0;
  while( true ) {
    cVar1 = "// Design \""[lVar9];
    if (iVar11 == (p->vOut).nCap) {
      if (iVar11 < 0x10) {
        pcVar6 = (p->vOut).pArray;
        if (pcVar6 == (char *)0x0) {
          pcVar6 = (char *)malloc(0x10);
        }
        else {
          pcVar6 = (char *)realloc(pcVar6,0x10);
        }
        (p->vOut).pArray = pcVar6;
        (p->vOut).nCap = 0x10;
      }
      else {
        uVar2 = iVar11 * 2;
        pcVar6 = (p->vOut).pArray;
        if (pcVar6 == (char *)0x0) {
          pcVar6 = (char *)malloc((ulong)uVar2);
        }
        else {
          pcVar6 = (char *)realloc(pcVar6,(ulong)uVar2);
        }
        (p->vOut).pArray = pcVar6;
        (p->vOut).nCap = uVar2;
      }
    }
    else {
      pcVar6 = (p->vOut).pArray;
    }
    iVar11 = (p->vOut).nSize;
    (p->vOut).nSize = iVar11 + 1;
    pcVar6[iVar11] = cVar1;
    if (lVar9 == 10) break;
    iVar11 = (p->vOut).nSize;
    lVar9 = lVar9 + 1;
  }
  pcVar6 = p->pName;
  sVar7 = strlen(pcVar6);
  if (0 < (int)(uint)sVar7) {
    uVar10 = 0;
    do {
      cVar1 = pcVar6[uVar10];
      uVar2 = (p->vOut).nSize;
      if (uVar2 == (p->vOut).nCap) {
        if ((int)uVar2 < 0x10) {
          pcVar8 = (p->vOut).pArray;
          if (pcVar8 == (char *)0x0) {
            pcVar8 = (char *)malloc(0x10);
          }
          else {
            pcVar8 = (char *)realloc(pcVar8,0x10);
          }
          (p->vOut).pArray = pcVar8;
          (p->vOut).nCap = 0x10;
        }
        else {
          sVar4 = (ulong)uVar2 * 2;
          pcVar8 = (p->vOut).pArray;
          if (pcVar8 == (char *)0x0) {
            pcVar8 = (char *)malloc(sVar4);
          }
          else {
            pcVar8 = (char *)realloc(pcVar8,sVar4);
          }
          (p->vOut).pArray = pcVar8;
          (p->vOut).nCap = (int)sVar4;
        }
      }
      else {
        pcVar8 = (p->vOut).pArray;
      }
      iVar11 = (p->vOut).nSize;
      (p->vOut).nSize = iVar11 + 1;
      pcVar8[iVar11] = cVar1;
      uVar10 = uVar10 + 1;
    } while (((uint)sVar7 & 0x7fffffff) != uVar10);
  }
  lVar9 = 0;
  do {
    cVar1 = "\" written via CBA package in ABC on "[lVar9];
    uVar2 = (p->vOut).nSize;
    if (uVar2 == (p->vOut).nCap) {
      if ((int)uVar2 < 0x10) {
        pcVar6 = (p->vOut).pArray;
        if (pcVar6 == (char *)0x0) {
          pcVar6 = (char *)malloc(0x10);
        }
        else {
          pcVar6 = (char *)realloc(pcVar6,0x10);
        }
        (p->vOut).pArray = pcVar6;
        (p->vOut).nCap = 0x10;
      }
      else {
        sVar7 = (ulong)uVar2 * 2;
        pcVar6 = (p->vOut).pArray;
        if (pcVar6 == (char *)0x0) {
          pcVar6 = (char *)malloc(sVar7);
        }
        else {
          pcVar6 = (char *)realloc(pcVar6,sVar7);
        }
        (p->vOut).pArray = pcVar6;
        (p->vOut).nCap = (int)sVar7;
      }
    }
    else {
      pcVar6 = (p->vOut).pArray;
    }
    iVar11 = (p->vOut).nSize;
    (p->vOut).nSize = iVar11 + 1;
    pcVar6[iVar11] = cVar1;
    lVar9 = lVar9 + 1;
  } while (lVar9 != 0x24);
  pcVar6 = Extra_TimeStamp();
  sVar7 = strlen(pcVar6);
  if (0 < (int)(uint)sVar7) {
    uVar10 = 0;
    do {
      cVar1 = pcVar6[uVar10];
      uVar2 = (p->vOut).nSize;
      if (uVar2 == (p->vOut).nCap) {
        if ((int)uVar2 < 0x10) {
          pcVar8 = (p->vOut).pArray;
          if (pcVar8 == (char *)0x0) {
            pcVar8 = (char *)malloc(0x10);
          }
          else {
            pcVar8 = (char *)realloc(pcVar8,0x10);
          }
          (p->vOut).pArray = pcVar8;
          (p->vOut).nCap = 0x10;
        }
        else {
          sVar4 = (ulong)uVar2 * 2;
          pcVar8 = (p->vOut).pArray;
          if (pcVar8 == (char *)0x0) {
            pcVar8 = (char *)malloc(sVar4);
          }
          else {
            pcVar8 = (char *)realloc(pcVar8,sVar4);
          }
          (p->vOut).pArray = pcVar8;
          (p->vOut).nCap = (int)sVar4;
        }
      }
      else {
        pcVar8 = (p->vOut).pArray;
      }
      iVar11 = (p->vOut).nSize;
      (p->vOut).nSize = iVar11 + 1;
      pcVar8[iVar11] = cVar1;
      uVar10 = uVar10 + 1;
    } while (((uint)sVar7 & 0x7fffffff) != uVar10);
  }
  lVar9 = 0;
  do {
    cVar1 = ".end\n\n\n"[lVar9 + 5];
    uVar2 = (p->vOut).nSize;
    if (uVar2 == (p->vOut).nCap) {
      if ((int)uVar2 < 0x10) {
        pcVar6 = (p->vOut).pArray;
        if (pcVar6 == (char *)0x0) {
          pcVar6 = (char *)malloc(0x10);
        }
        else {
          pcVar6 = (char *)realloc(pcVar6,0x10);
        }
        (p->vOut).pArray = pcVar6;
        (p->vOut).nCap = 0x10;
      }
      else {
        sVar7 = (ulong)uVar2 * 2;
        pcVar6 = (p->vOut).pArray;
        if (pcVar6 == (char *)0x0) {
          pcVar6 = (char *)malloc(sVar7);
        }
        else {
          pcVar6 = (char *)realloc(pcVar6,sVar7);
        }
        (p->vOut).pArray = pcVar6;
        (p->vOut).nCap = (int)sVar7;
      }
    }
    else {
      pcVar6 = (p->vOut).pArray;
    }
    iVar11 = (p->vOut).nSize;
    (p->vOut).nSize = iVar11 + 1;
    pcVar6[iVar11] = cVar1;
    lVar9 = lVar9 + 1;
  } while (lVar9 != 2);
  if (1 < (p->vNtks).nSize) {
    lVar9 = 1;
    do {
      Cba_ManWriteVerilogNtk((Cba_Ntk_t *)(p->vNtks).pArray[lVar9],fInlineConcat);
      lVar9 = lVar9 + 1;
    } while (lVar9 < (p->vNtks).nSize);
  }
  if (0 < (p->vOut).nSize) {
    __s = fopen(pFileName,"wb");
    if (__s != (FILE *)0x0) {
      fwrite((p->vOut).pArray,1,(long)(p->vOut).nSize,__s);
      fclose(__s);
      return;
    }
    printf("Cannot open file \"%s\" for writing.\n",pFileName);
    return;
  }
  return;
}

Assistant:

void Cba_ManWriteVerilog( char * pFileName, Cba_Man_t * p, int fInlineConcat )
{
    Cba_Ntk_t * pNtk; int i;
    // check the library
    if ( p->pMioLib && p->pMioLib != Abc_FrameReadLibGen() )
    {
        printf( "Genlib library used in the mapped design is not longer a current library.\n" );
        return;
    }
    Cba_ManCreatePrimMap( p->pTypeNames );
    // derive the stream
    p->nOpens = 1;
    Vec_StrClear( &p->vOut );
    Vec_StrClear( &p->vOut2 );
    Vec_StrPrintStr( &p->vOut, "// Design \"" );
    Vec_StrPrintStr( &p->vOut, Cba_ManName(p) );
    Vec_StrPrintStr( &p->vOut, "\" written via CBA package in ABC on " );
    Vec_StrPrintStr( &p->vOut, Extra_TimeStamp() );
    Vec_StrPrintStr( &p->vOut, "\n\n" );
    Cba_ManForEachNtk( p, pNtk, i )
        Cba_ManWriteVerilogNtk( pNtk, fInlineConcat );
    // dump into file
    if ( Vec_StrSize(&p->vOut) > 0 )
    {
        FILE * pFile = fopen( pFileName, "wb" );
        if ( pFile == NULL )
            printf( "Cannot open file \"%s\" for writing.\n", pFileName );
        else
        {
            fwrite( Vec_StrArray(&p->vOut), 1, Vec_StrSize(&p->vOut), pFile );
            fclose( pFile );
        }
    }
}